

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,true>::
AddProperty<Js::JavascriptString*>
          (SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,true> *this,
          DynamicObject *instance,JavascriptString *propertyKey,Var value,
          PropertyAttributes attributes,PropertyValueInfo *info,PropertyOperationFlags flags,
          SideEffects possibleSideEffects)

{
  Type *pTVar1;
  RecyclerWeakReference<Js::DynamicObject> *pRVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  uint uVar6;
  undefined4 *puVar7;
  SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_true> *this_00;
  BigSimpleDictionaryTypeHandler *this_01;
  SimpleDictionaryPropertyDescriptor<int> *pSVar8;
  JavascriptString **ppJVar9;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  int index_00;
  undefined4 uVar10;
  undefined7 in_register_00000081;
  DynamicObject *instance_00;
  JavascriptString *local_70;
  SimpleDictionaryPropertyDescriptor<int> *descriptor;
  PropertyValueInfo *local_60;
  ScriptContext *local_58;
  DynamicObject *local_50;
  uint local_44;
  JavascriptString *local_40;
  JavascriptString *propertyKey_local;
  int index;
  
  local_58 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr;
  local_60 = info;
  local_40 = propertyKey;
  bVar4 = JsUtil::
          BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::JavascriptString*>
                    (*(BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
                       **)(this + 0x18),&local_40,
                     (SimpleDictionaryPropertyDescriptor<int> **)&local_70);
  if (bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0xa6e,"(!propertyMap->TryGetReference(propertyKey, &descriptor))",
                                "!propertyMap->TryGetReference(propertyKey, &descriptor)");
    if (!bVar4) goto LAB_00ca1661;
    *puVar7 = 0;
  }
  if (((flags & PropertyOperation_Force) == PropertyOperation_None) &&
     (bVar4 = DynamicTypeHandler::VerifyIsExtensible
                        ((DynamicTypeHandler *)this,local_58,
                         (flags & (PropertyOperation_ThrowIfNotExtensible|
                                  PropertyOperation_StrictMode)) != PropertyOperation_None), !bVar4)
     ) {
    return 0;
  }
  local_44 = (uint)CONCAT71(in_register_00000081,attributes);
  if (((byte)this[9] & 4) == 0) {
    pTVar1 = (instance->super_RecyclableObject).type.ptr;
    this_00 = (SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_true> *)this;
    if (*(char *)&pTVar1[1].javascriptLibrary.ptr == '\x01') {
      if ((((byte)this[9] & 0x10) != 0) ||
         (*(char *)((long)&pTVar1[1].javascriptLibrary.ptr + 1) == '\x01')) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0xa93,
                                    "(!GetIsShared() && !instance->GetDynamicType()->GetIsShared())"
                                    ,"!GetIsShared() && !instance->GetDynamicType()->GetIsShared()")
        ;
        if (!bVar4) goto LAB_00ca1661;
        *puVar7 = 0;
      }
      DynamicObject::ChangeType(instance);
    }
  }
  else {
    this_00 = (SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_true> *)
              SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true>::
              ConvertToNonSharedSimpleDictionaryType
                        ((SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true> *)this,
                         instance);
  }
  TPropertyKey_IsInternalPropertyId(local_40);
  if (*(int *)(this + 0xc) <= *(int *)(this + 0x2c)) {
    if (0x3ffffffe < *(int *)(this + 0xc)) {
      this_01 = SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true>::
                ConvertToBigSimpleDictionaryTypeHandler
                          ((SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true> *)
                           this,instance);
      BVar5 = SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false>::
              AddProperty<Js::JavascriptString*>
                        ((SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false> *)this_01
                         ,instance,local_40,value,(PropertyAttributes)local_44,local_60,flags,
                         possibleSideEffects);
      return BVar5;
    }
    SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true>::EnsureSlotCapacity
              (&this_00->super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true>,
               instance);
  }
  local_50 = instance;
  if (value == (Var)0x0 && (char)((flags & PropertyOperation_SpecialValue) >> 4) == '\0') {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0xaaf,
                                "((flags & PropertyOperation_SpecialValue) != 0 || value != nullptr)"
                                ,"(flags & PropertyOperation_SpecialValue) != 0 || value != nullptr"
                               );
    if (!bVar4) goto LAB_00ca1661;
    *puVar7 = 0;
  }
  if (((this_00->super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true>).
       super_DynamicTypeHandler.flags & 0x10) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0xab0,"(!typeHandler->GetIsShared())","!typeHandler->GetIsShared()"
                               );
    if (!bVar4) goto LAB_00ca1661;
    *puVar7 = 0;
  }
  pRVar2 = (this_00->super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true>).
           singletonInstance.ptr;
  if ((pRVar2 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) &&
     ((DynamicObject *)(pRVar2->super_RecyclerWeakReferenceBase).strongRef != local_50)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0xab1,
                                "(typeHandler->singletonInstance == nullptr || typeHandler->singletonInstance->Get() == instance)"
                                ,
                                "typeHandler->singletonInstance == nullptr || typeHandler->singletonInstance->Get() == instance"
                               );
    if (!bVar4) goto LAB_00ca1661;
    *puVar7 = 0;
  }
  if ((flags & PropertyOperation_PreInit) == PropertyOperation_None) {
    TPropertyKey_IsInternalPropertyId(local_40);
    instance_00 = local_50;
    if ((((flags & (PropertyOperation_NonFixedValue|PropertyOperation_SpecialValue)) ==
          PropertyOperation_None) &&
        (pRVar2 = (this_00->super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true>
                  ).singletonInstance.ptr, pRVar2 != (RecyclerWeakReference<Js::DynamicObject> *)0x0
        )) && ((DynamicObject *)(pRVar2->super_RecyclerWeakReferenceBase).strongRef == local_50)) {
      bVar4 = VarIs<Js::JavascriptFunction>(value);
      if (bVar4) {
        bVar4 = DynamicTypeHandler::ShouldFixMethodProperties();
        uVar10 = (undefined4)CONCAT71(extraout_var,bVar4);
      }
      else {
        bVar4 = DynamicTypeHandler::ShouldFixDataProperties();
        if (!bVar4) goto LAB_00ca1464;
        bVar4 = DynamicTypeHandler::CheckHeuristicsForFixedDataProps(instance_00,local_40,value);
        uVar10 = (undefined4)CONCAT71(extraout_var_00,bVar4);
      }
    }
    else {
LAB_00ca1464:
      uVar10 = 0;
    }
  }
  else {
    uVar10 = 0;
    instance_00 = local_50;
  }
  if (((this_00->super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true>).
       field_0x28 & 2) != 0) {
    local_50 = (DynamicObject *)CONCAT44(local_50._4_4_,uVar10);
    bVar4 = SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_true>::
            TryReuseDeletedPropertyIndex(this_00,instance_00,(int *)((long)&propertyKey_local + 4));
    uVar10 = local_50._0_4_;
    if (bVar4) {
      descriptor = (SimpleDictionaryPropertyDescriptor<int> *)value;
      pSVar8 = JsUtil::
               BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
               ::GetValueAt((this_00->
                            super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true>
                            ).propertyMap.ptr,propertyKey_local._4_4_);
      index_00 = pSVar8->propertyIndex;
      if (pSVar8->propertyIndex != propertyKey_local._4_4_) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0xac0,
                                    "(typeHandler->propertyMap->GetValueAt(index).propertyIndex == index)"
                                    ,
                                    "typeHandler->propertyMap->GetValueAt(index).propertyIndex == index"
                                   );
        if (!bVar4) {
LAB_00ca1661:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar7 = 0;
        index_00 = propertyKey_local._4_4_;
      }
      ppJVar9 = JsUtil::
                BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                ::GetKeyAt((this_00->
                           super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true>)
                           .propertyMap.ptr,index_00);
      local_70 = *ppJVar9;
      JsUtil::
      BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
      ::Remove((this_00->super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true>).
               propertyMap.ptr,&local_70);
      uVar6 = local_44;
      Add<Js::JavascriptString*>
                ((SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,true> *)this_00,
                 propertyKey_local._4_4_,local_40,(PropertyAttributes)local_44,
                 (flags & PropertyOperation_PreInit) == PropertyOperation_None,local_50._0_1_,false,
                 local_58);
      value = descriptor;
      goto LAB_00ca1585;
    }
  }
  uVar6 = local_44;
  propertyKey_local._4_4_ = *(int *)(this + 0x2c);
  Add<Js::JavascriptString*>
            ((SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,true> *)this_00,local_40,
             (PropertyAttributes)local_44,
             (flags & PropertyOperation_PreInit) == PropertyOperation_None,SUB41(uVar10,0),false,
             local_58);
LAB_00ca1585:
  if ((uVar6 & 1) != 0) {
    DynamicObject::SetHasNoEnumerableProperties(instance_00,false);
  }
  DynamicTypeHandler::SetSlotUnchecked(instance_00,propertyKey_local._4_4_,value);
  if (local_60 != (PropertyValueInfo *)0x0) {
    local_60->m_instance = &instance_00->super_RecyclableObject;
    local_60->m_propertyIndex = 0xffff;
    local_60->m_attributes = '\0';
    local_60->flags = InlineCacheNoFlags;
  }
  uVar6 = TPropertyKey_GetOptionalPropertyId<Js::JavascriptString*>(local_58,local_40);
  if (uVar6 != 0xffffffff) {
    if ((((this_00->super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true>).
          super_DynamicTypeHandler.flags & 0x20) != 0) ||
       ((0xf < uVar6 &&
        (BVar5 = JavascriptOperators::HasProxyOrPrototypeInlineCacheProperty
                           (&instance_00->super_RecyclableObject,uVar6), BVar5 != 0)))) {
      ScriptContext::InvalidateProtoCaches(local_58,uVar6);
    }
    DynamicTypeHandler::SetPropertyUpdateSideEffect
              ((DynamicTypeHandler *)this,instance_00,uVar6,value,possibleSideEffects);
  }
  return 1;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::AddProperty(DynamicObject* instance, TPropertyKey propertyKey, Var value, PropertyAttributes attributes,
        PropertyValueInfo* info, PropertyOperationFlags flags, SideEffects possibleSideEffects)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();
#if DBG
        // Only Assert that the propertyMap doesn't contain propertyKey if TMapKey is string and propertyKey is not a symbol.
        if (!TMapKey_IsJavascriptString<TMapKey>() || !TMapKey_IsSymbol(propertyKey, scriptContext))
        {
            SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;
            Assert(!propertyMap->TryGetReference(propertyKey, &descriptor));
        }
        Assert(!TPropertyKey_IsNumeric(propertyKey));
#endif

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        if (CONFIG_FLAG(ForceStringKeyedSimpleDictionaryTypeHandler) &&
            !TMapKey_IsJavascriptString<TMapKey>() &&
            !isUnordered && !hasNamelessPropertyId &&
            !TPropertyKey_IsInternalPropertyId(propertyKey) &&
            !TMapKey_IsSymbol(propertyKey, scriptContext))
        {
            return ConvertToSimpleDictionaryUnorderedTypeHandler<TPropertyIndex, JavascriptString*, IsNotExtensibleSupported>(instance)
                ->AddProperty(instance, propertyKey, value, attributes, info, flags, possibleSideEffects);
        }
#endif

        if (IsNotExtensibleSupported)
        {
            bool isForce = (flags & PropertyOperation_Force) != 0;
            if (!isForce)
            {
                bool throwIfNotExtensible = (flags & (PropertyOperation_ThrowIfNotExtensible | PropertyOperation_StrictMode)) != 0;
                if (!this->VerifyIsExtensible(scriptContext, throwIfNotExtensible))
                {
                    return FALSE;
                }
            }
        }

        SimpleDictionaryTypeHandlerBase * typeHandler = this;
        if (GetIsLocked())
        {
            typeHandler = ConvertToNonSharedSimpleDictionaryType(instance);
        }
        else if(instance->GetDynamicType()->GetIsLocked())
        {
            Assert(!GetIsShared() && !instance->GetDynamicType()->GetIsShared());

            // We have changed the type of the only instance using this type handler, so we don't need to say the type handler is shared here.
            instance->ChangeType();
        }

        if (TMapKey_IsJavascriptString<TMapKey>() &&
            (TPropertyKey_IsInternalPropertyId(propertyKey) || TMapKey_IsSymbol(propertyKey, scriptContext)))
        {
            PHASE_PRINT_TESTTRACE1(Js::TypeHandlerTransitionPhase, _u("Transitioning from string keyed to PropertyRecord keyed SimpleDictionaryUnorderedTypeHandler\n"));
            // String keyed type handler cannot store InternalPropertyRecords since they have no string representation
            return ConvertToSimpleDictionaryUnorderedTypeHandler<TPropertyIndex, const PropertyRecord*, IsNotExtensibleSupported>(instance)
                ->AddProperty(instance, propertyKey, value, attributes, info, flags, possibleSideEffects);
        }

        // CONSIDER: Do this after TryReuseDeletedPropertyIndex. If we can reuse slots, no need to grow right now.
        if (this->GetSlotCapacity() <= nextPropertyIndex)
        {
            if (this->GetSlotCapacity() >= MaxPropertyIndexSize)
            {
                BigSimpleDictionaryTypeHandler* newTypeHandler = ConvertToBigSimpleDictionaryTypeHandler(instance);

                return newTypeHandler->AddProperty(instance, propertyKey, value, attributes, info, flags, possibleSideEffects);
            }

            typeHandler->EnsureSlotCapacity(instance);
        }

        Assert((flags & PropertyOperation_SpecialValue) != 0 || value != nullptr);
        Assert(!typeHandler->GetIsShared());
        Assert(typeHandler->singletonInstance == nullptr || typeHandler->singletonInstance->Get() == instance);
#if ENABLE_FIXED_FIELDS
        bool markAsInitialized = ((flags & PropertyOperation_PreInit) == 0);
        bool markAsFixed = markAsInitialized && !TPropertyKey_IsInternalPropertyId(propertyKey) && (flags & (PropertyOperation_NonFixedValue | PropertyOperation_SpecialValue)) == 0 &&
            typeHandler->singletonInstance != nullptr && typeHandler->singletonInstance->Get() == instance
            && (VarIs<JavascriptFunction>(value) ? ShouldFixMethodProperties() : (ShouldFixDataProperties() && CheckHeuristicsForFixedDataProps(instance, propertyKey, value)));
#else
        bool markAsInitialized = true;
        bool markAsFixed = false;
#endif
        TPropertyIndex index;
        if (typeHandler->isUnordered &&
            typeHandler->AsUnordered()->TryReuseDeletedPropertyIndex(instance, &index))
        {
            // We are reusing a deleted property index for the new property ID. Update the property map.
            Assert(typeHandler->propertyMap->GetValueAt(index).propertyIndex == index);
            TMapKey deletedPropertyKey = typeHandler->propertyMap->GetKeyAt(index);
            typeHandler->propertyMap->Remove(deletedPropertyKey);
            typeHandler->Add(index, propertyKey, attributes, markAsInitialized, markAsFixed, false, scriptContext);
        }
        else
        {
            index = nextPropertyIndex;
            typeHandler->Add(propertyKey, attributes, markAsInitialized, markAsFixed, false, scriptContext);
        }

        if (attributes & PropertyEnumerable)
        {
            instance->SetHasNoEnumerableProperties(false);
        }

        SetSlotUnchecked(instance, index, value);

        // It's ok to populate inline cache here even if this handler isn't shared yet, because we don't have property add
        // inline cache flavor for SimpleDictionaryTypeHandlers.  This ensures that a) no new instance reaches this handler
        // without us knowing, and b) the inline cache doesn't inadvertently become polymorphic.
        if (markAsInitialized && !markAsFixed)
        {
            SetPropertyValueInfoNonFixed(info, instance, index, attributes);
        }
        else
        {
            PropertyValueInfo::SetNoCache(info, instance);
        }

        PropertyId propertyId = TPropertyKey_GetOptionalPropertyId(scriptContext, propertyKey);
        if (propertyId != Constants::NoProperty)
        {
            if ((typeHandler->GetFlags() & IsPrototypeFlag)
                || (!IsInternalPropertyId(propertyId)
                && JavascriptOperators::HasProxyOrPrototypeInlineCacheProperty(instance, propertyId)))
            {
                // We don't evolve dictionary types when adding a field, so we need to invalidate prototype caches.
                // We only have to do this though if the current type is used as a prototype, or the current property
                // is found on the prototype chain.
                scriptContext->InvalidateProtoCaches(propertyId);
            }
            SetPropertyUpdateSideEffect(instance, propertyId, value, possibleSideEffects);
        }
        return true;
    }